

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGenerators::FileDiffers(cmQtAutoGenerators *this,string *filename,string *content)

{
  bool bVar1;
  undefined1 local_48 [8];
  string oldContents;
  bool differs;
  string *content_local;
  string *filename_local;
  cmQtAutoGenerators *this_local;
  
  oldContents.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::string((string *)local_48);
  bVar1 = ReadAll((string *)local_48,filename);
  if (bVar1) {
    oldContents.field_2._M_local_buf[0xf] =
         std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_48,content);
  }
  std::__cxx11::string::~string((string *)local_48);
  return (bool)(oldContents.field_2._M_local_buf[0xf] & 1);
}

Assistant:

bool cmQtAutoGenerators::FileDiffers(const std::string& filename,
                                     const std::string& content)
{
  bool differs = true;
  {
    std::string oldContents;
    if (ReadAll(oldContents, filename)) {
      differs = (oldContents != content);
    }
  }
  return differs;
}